

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

path * __thiscall StringLiteral::path(path *__return_storage_ptr__,StringLiteral *this)

{
  pointer pcVar1;
  size_type sVar2;
  
  pcVar1 = (this->_value)._M_dataplus._M_p;
  sVar2 = (this->_value)._M_string_length;
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  ghc::filesystem::path::postprocess_path_with_format(&__return_storage_ptr__->_path,auto_format);
  return __return_storage_ptr__;
}

Assistant:

fs::path path() const
	{
		return fs::u8path(_value);
	}